

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerReinterpretInt64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *this_00;
  Builder *this_01;
  undefined1 auVar1 [16];
  size_t sVar2;
  char *pcVar3;
  Call *append;
  Call *append_00;
  Block *pBVar4;
  Type *args;
  Module *this_02;
  string_view sVar5;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  Name target_01;
  Const *local_d8;
  Expression *local_d0;
  Const *local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [8];
  TempVar highBits;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_78;
  Call *local_60;
  _Head_base<0UL,_wasm::Memory_*,_false> local_58;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  pointer local_48;
  allocator_type local_32;
  allocator_type local_31;
  
  fetchOutParam((TempVar *)local_b8,this,curr->value);
  pcVar3 = DAT_010b10d8;
  sVar2 = ABI::wasm2js::SCRATCH_STORE_I32;
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_d8 = Builder::makeConst<int>(this_00,0);
  local_d0 = curr->value;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d8;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &stack0xffffffffffffffa8,__l,&local_32);
  target.super_IString.str._M_str = pcVar3;
  target.super_IString.str._M_len = sVar2;
  local_60 = Builder::makeCall(this_00,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &stack0xffffffffffffffa8,(Type)0x0,false);
  pcVar3 = DAT_010b10d8;
  sVar2 = ABI::wasm2js::SCRATCH_STORE_I32;
  this_01 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_c8 = Builder::makeConst<int>(this_01,1);
  if ((char)highBits.pass != '\x01') {
    local_c0 = (undefined1 *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
    *local_c0 = 8;
    *(undefined4 *)(local_c0 + 0x10) = local_b8._0_4_;
    *(undefined8 *)(local_c0 + 8) = 2;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_c8;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_78,__l_00,&local_31);
    target_00.super_IString.str._M_str = pcVar3;
    target_00.super_IString.str._M_len = sVar2;
    append = Builder::makeCall(this_01,target_00,&local_78,(Type)0x0,false);
    args = &highBits.ty;
    highBits.ty.id = 0;
    target_01.super_IString.str._M_str = DAT_010b1108;
    target_01.super_IString.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
    append_00 = Builder::makeCall((this->builder)._M_t.
                                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                  .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                                  target_01,
                                  (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                                  )args,(Type)0x5,false);
    pBVar4 = Builder::blockify(this_00,(Expression *)local_60,(Expression *)append);
    pBVar4 = Builder::blockify(this_00,(Expression *)pBVar4,(Expression *)append_00);
    if (highBits.ty.id != 0) {
      operator_delete((void *)highBits.ty.id,-highBits.ty.id);
    }
    if (local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)local_58._M_head_impl
        != (Memory *)0x0) {
      operator_delete(local_58._M_head_impl,(long)local_48 - (long)local_58._M_head_impl);
    }
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)pBVar4);
    this_02 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
              currModule;
    if ((this_02->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_02->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sVar5 = IString::interned((IString *)0x1,(string_view)ZEXT816(0xdf9ff1),SUB81(args,0));
      local_58._M_head_impl = (Memory *)operator_new(0x58);
      ((string_view *)((long)local_58._M_head_impl + 0x40))->_M_len = 0;
      *(char **)((long)local_58._M_head_impl + 0x48) = (char *)0x0;
      ((string_view *)((long)local_58._M_head_impl + 0x30))->_M_len = 0;
      ((Address *)((long)local_58._M_head_impl + 0x38))->addr = 0;
      ((string_view *)((long)local_58._M_head_impl + 0x20))->_M_len = 0;
      (((Name *)((long)local_58._M_head_impl + 0x28))->super_IString).str._M_len = 0;
      ((string_view *)((long)local_58._M_head_impl + 0x10))->_M_len = 0;
      (((Name *)((long)local_58._M_head_impl + 0x18))->super_IString).str._M_len = 0;
      *(string_view *)local_58._M_head_impl = sVar5;
      ((string_view *)((long)local_58._M_head_impl + 0x50))->_M_len = 2;
      args = (Type *)0x1;
      ((string_view *)((long)local_58._M_head_impl + 0x40))->_M_len = 1;
      ((Address *)((long)local_58._M_head_impl + 0x38))->addr = 1;
      Module::addMemory(this_02,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                &stack0xffffffffffffffa8);
      if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
          local_58._M_head_impl != (Memory *)0x0) {
        operator_delete(local_58._M_head_impl,0x58);
      }
      this_02 = (this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
                currModule;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = args;
    ABI::wasm2js::ensureHelpers((wasm2js *)this_02,(Module *)0x0,(IString)(auVar1 << 0x40));
    TempVar::~TempVar((TempVar *)local_b8);
    return;
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerReinterpretInt64(Unary* curr) {
    // Assume that the wasm file assumes the address 0 is invalid and roundtrip
    // our i64 through memory at address 0
    TempVar highBits = fetchOutParam(curr->value);
    Block* result = builder->blockify(
      builder->makeCall(ABI::wasm2js::SCRATCH_STORE_I32,
                        {builder->makeConst(int32_t(0)), curr->value},
                        Type::none),
      builder->makeCall(ABI::wasm2js::SCRATCH_STORE_I32,
                        {builder->makeConst(int32_t(1)),
                         builder->makeLocalGet(highBits, Type::i32)},
                        Type::none),
      builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_F64, {}, Type::f64));
    replaceCurrent(result);
    MemoryUtils::ensureExists(getModule());
    ABI::wasm2js::ensureHelpers(getModule());
  }